

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_CutCheckDominance(Ivy_Cut_t *pDom,Ivy_Cut_t *pCut)

{
  int local_28;
  int local_24;
  int k;
  int i;
  Ivy_Cut_t *pCut_local;
  Ivy_Cut_t *pDom_local;
  
  local_24 = 0;
  while( true ) {
    if (pDom->nSize <= local_24) {
      return 1;
    }
    if ((local_24 != 0) && (pDom->pArray[local_24] <= pDom->pArray[local_24 + -1])) break;
    for (local_28 = 0;
        (local_28 < pCut->nSize && (pDom->pArray[local_24] != pCut->pArray[local_28]));
        local_28 = local_28 + 1) {
    }
    if (local_28 == pCut->nSize) {
      return 0;
    }
    local_24 = local_24 + 1;
  }
  __assert_fail("i==0 || pDom->pArray[i-1] < pDom->pArray[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                ,0x353,"int Ivy_CutCheckDominance(Ivy_Cut_t *, Ivy_Cut_t *)");
}

Assistant:

static inline int Ivy_CutCheckDominance( Ivy_Cut_t * pDom, Ivy_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < pDom->nSize; i++ )
    {
        for ( k = 0; k < pCut->nSize; k++ )
            if ( pDom->pArray[i] == pCut->pArray[k] )
                break;
        if ( k == pCut->nSize ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}